

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O2

spv_result_t spvtools::val::ModeSettingPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  _Rb_tree_color _Var2;
  pointer psVar3;
  pointer psVar4;
  pointer pIVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint16_t uVar9;
  uint uVar10;
  ExecutionModel EVar11;
  uint uVar12;
  int32_t iVar13;
  MemoryModel MVar14;
  AddressingModel AVar15;
  ExecutionMode EVar16;
  uint id;
  Decoration DVar17;
  BuiltIn BVar18;
  Instruction *pIVar19;
  Instruction *pIVar20;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *psVar21;
  size_type sVar22;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var23;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar24;
  _Base_ptr p_Var25;
  _Base_ptr p_Var26;
  spv_result_t sVar27;
  difference_type __n;
  ulong uVar28;
  Capability CVar29;
  char *pcVar30;
  difference_type __n_1;
  _Rb_tree_header *p_Var31;
  long lVar32;
  Instruction *i;
  pointer this;
  uint64_t x_size;
  uint64_t z_size;
  uint64_t y_size;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  uVar9 = (inst->inst_).opcode;
  if (uVar9 == 0xe) {
    MVar14 = ValidationState_t::memory_model(_);
    if ((MVar14 == MemoryModelVulkan) ||
       (bVar6 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityVulkanMemoryModel), !bVar6)) {
      bVar6 = spvIsOpenCLEnv(_->context_->target_env);
      if (!bVar6) {
LAB_00595422:
        bVar6 = spvIsVulkanEnv(_->context_->target_env);
        if (((bVar6) &&
            (AVar15 = ValidationState_t::addressing_model(_), AVar15 != AddressingModelLogical)) &&
           (AVar15 = ValidationState_t::addressing_model(_),
           AVar15 != AddressingModelPhysicalStorageBuffer64)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&x_size,_,0x121b,(char *)0x0);
          std::operator<<((ostream *)local_208,(string *)&x_size);
          std::operator<<((ostream *)local_208,
                          "Addressing model must be Logical or PhysicalStorageBuffer64 ");
          pcVar30 = "in the Vulkan environment.";
          goto LAB_005954f0;
        }
        goto LAB_00595fe8;
      }
      AVar15 = ValidationState_t::addressing_model(_);
      if ((AVar15 == AddressingModelPhysical32) ||
         (AVar15 = ValidationState_t::addressing_model(_), AVar15 == AddressingModelPhysical64)) {
        MVar14 = ValidationState_t::memory_model(_);
        if (MVar14 == MemoryModelOpenCL) goto LAB_00595422;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = "Memory model must be OpenCL in the OpenCL environment.";
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)local_208,"Addressing model must be Physical32 or Physical64 ");
        pcVar30 = "in the OpenCL environment.";
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar30 = 
      "VulkanMemoryModelKHR capability must only be specified if the VulkanKHR memory model is used."
      ;
    }
    goto LAB_00595fcd;
  }
  if ((uVar9 != 0x14b) && (uVar9 != 0x10)) {
    if (uVar9 != 0xf) goto LAB_00595fe8;
    uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar19 = ValidationState_t::FindDef(_,uVar10);
    if ((pIVar19 == (Instruction *)0x0) || ((pIVar19->inst_).opcode != 0x36)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_208,"OpEntryPoint Entry Point <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&x_size,_,uVar10);
      std::operator<<((ostream *)local_208,(string *)&x_size);
      pcVar30 = " is not a function.";
      goto LAB_005954f0;
    }
    EVar11 = Instruction::GetOperandAs<spv::ExecutionModel>(inst,0);
    if (EVar11 == ExecutionModelKernel) {
LAB_005950e1:
      pIVar19 = ValidationState_t::FindDef(_,(pIVar19->inst_).type_id);
      if ((pIVar19 == (Instruction *)0x0) || ((pIVar19->inst_).opcode != 0x13)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&x_size,_,0x1219,(char *)0x0);
        std::operator<<((ostream *)local_208,(string *)&x_size);
        std::operator<<((ostream *)local_208,"OpEntryPoint Entry Point <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&y_size,_,uVar10);
        std::operator<<((ostream *)local_208,(string *)&y_size);
        pcVar30 = "s function return type is not void.";
        goto LAB_00595764;
      }
      psVar21 = ValidationState_t::GetExecutionModes(_,uVar10);
      bVar6 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (bVar6) {
        if (EVar11 - ExecutionModelTessellationControl < 2) {
          if (psVar21 ==
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) goto LAB_005961d6;
          p_Var31 = &(psVar21->_M_t)._M_impl.super__Rb_tree_header;
          uVar28 = 0;
          p_Var26 = (psVar21->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          for (p_Var25 = p_Var26; (_Rb_tree_header *)p_Var25 != p_Var31;
              p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
            uVar28 = uVar28 + (p_Var25[1]._M_color - _S_black < 3);
          }
          if (uVar28 < 2) {
            lVar32 = 0;
            for (p_Var25 = p_Var26; (_Rb_tree_header *)p_Var25 != p_Var31;
                p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
              if ((p_Var25[1]._M_color < 0x1a) &&
                 ((0x3400000U >> (p_Var25[1]._M_color & 0x1f) & 1) != 0)) {
                lVar32 = lVar32 + 1;
              }
            }
            if (lVar32 < 2) {
              uVar28 = 0;
              for (; (_Rb_tree_header *)p_Var26 != p_Var31;
                  p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
                uVar28 = uVar28 + ((p_Var26[1]._M_color & ~_S_black) == 4);
              }
              if (uVar28 < 2) goto LAB_005961d6;
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar30 = 
              "Tessellation execution model entry points can specify at most one of VertexOrderCw or VertexOrderCcw execution modes."
              ;
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar30 = 
              "Tessellation execution model entry points can specify at most one of Triangles, Quads or Isolines execution modes."
              ;
            }
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar30 = 
            "Tessellation execution model entry points can specify at most one of SpacingEqual, SpacingFractionalOdd or SpacingFractionalEven execution modes."
            ;
          }
        }
        else if (EVar11 == ExecutionModelGeometry) {
          if (psVar21 !=
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) {
            p_Var31 = &(psVar21->_M_t)._M_impl.super__Rb_tree_header;
            lVar32 = 0;
            p_Var26 = (psVar21->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var25 = p_Var26; (_Rb_tree_header *)p_Var25 != p_Var31;
                p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
              lVar32 = lVar32 + (ulong)(p_Var25[1]._M_color - 0x13 < 5);
            }
            if (lVar32 == 1) {
              lVar32 = 0;
              for (; (_Rb_tree_header *)p_Var26 != p_Var31;
                  p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
                lVar32 = lVar32 + (ulong)(p_Var26[1]._M_color - 0x1b < 3);
              }
              if (lVar32 != 1) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar30 = 
                "Geometry execution model entry points must specify exactly one of OutputPoints, OutputLineStrip or OutputTriangleStrip execution modes."
                ;
                goto LAB_00595fcd;
              }
              goto LAB_005961d6;
            }
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar30 = 
          "Geometry execution model entry points must specify exactly one of InputPoints, InputLines, InputLinesAdjacency, Triangles or InputTrianglesAdjacency execution modes."
          ;
        }
        else if (EVar11 == ExecutionModelMeshEXT) {
          if (psVar21 !=
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) {
            p_Var31 = &(psVar21->_M_t)._M_impl.super__Rb_tree_header;
            lVar32 = 0;
            p_Var26 = (psVar21->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var25 = p_Var26; (_Rb_tree_header *)p_Var25 != p_Var31;
                p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
              _Var2 = p_Var25[1]._M_color;
              if (((_Var2 == 0x1b) || (_Var2 == 0x14b2)) || (_Var2 == 0x1495)) {
                lVar32 = lVar32 + 1;
              }
            }
            if (lVar32 == 1) {
              lVar32 = 0;
              for (; (_Rb_tree_header *)p_Var26 != p_Var31;
                  p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
                lVar32 = lVar32 + (ulong)(p_Var26[1]._M_color == 0x1a ||
                                         p_Var26[1]._M_color == 0x1496);
              }
              if (lVar32 != 2) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar30 = 
                "MeshEXT execution model entry points must specify both OutputPrimitivesEXT and OutputVertices Execution Modes."
                ;
                goto LAB_00595fcd;
              }
              goto LAB_005961d6;
            }
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar30 = 
          "MeshEXT execution model entry points must specify exactly one of OutputPoints, OutputLinesEXT, or OutputTrianglesEXT Execution Modes."
          ;
        }
        else {
          if (EVar11 != ExecutionModelFragment) goto LAB_005961d6;
          if (psVar21 ==
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) {
LAB_005960e1:
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar30 = 
            "Fragment execution model entry points require either an OriginUpperLeft or OriginLowerLeft execution mode."
            ;
          }
          else {
            local_208._0_4_ = 7;
            sVar22 = std::
                     set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                     ::count(psVar21,(key_type *)local_208);
            if (sVar22 != 0) {
              x_size._0_4_ = 8;
              sVar22 = std::
                       set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                       ::count(psVar21,(key_type *)&x_size);
              if (sVar22 != 0) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar30 = 
                "Fragment execution model entry points can only specify one of OriginUpperLeft or OriginLowerLeft execution modes."
                ;
                goto LAB_00595fcd;
              }
            }
            local_208._0_4_ = 7;
            sVar22 = std::
                     set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                     ::count(psVar21,(key_type *)local_208);
            if (sVar22 == 0) {
              x_size._0_4_ = 8;
              sVar22 = std::
                       set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                       ::count(psVar21,(key_type *)&x_size);
              if (sVar22 == 0) goto LAB_005960e1;
            }
            p_Var31 = &(psVar21->_M_t)._M_impl.super__Rb_tree_header;
            uVar28 = 0;
            p_Var26 = (psVar21->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var25 = p_Var26; (_Rb_tree_header *)p_Var25 != p_Var31;
                p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
              uVar28 = uVar28 + (p_Var25[1]._M_color - 0xe < 3);
            }
            if (uVar28 < 2) {
              uVar28 = 0;
              for (p_Var25 = p_Var26; (_Rb_tree_header *)p_Var25 != p_Var31;
                  p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
                uVar28 = uVar28 + (p_Var25[1]._M_color - 0x14f6 < 6);
              }
              if (uVar28 < 2) {
                uVar28 = 0;
                for (p_Var25 = p_Var26; (_Rb_tree_header *)p_Var25 != p_Var31;
                    p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25)) {
                  uVar28 = uVar28 + (p_Var25[1]._M_color - 0x13d7 < 3);
                }
                if (uVar28 < 2) {
                  uVar28 = 0;
                  for (; (_Rb_tree_header *)p_Var26 != p_Var31;
                      p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
                    uVar28 = uVar28 + (p_Var26[1]._M_color - 0x13da < 3);
                  }
                  if (uVar28 < 2) goto LAB_005961d6;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar30 = 
                  "Fragment execution model entry points can specify at most one of StencilRefUnchangedBackAMD, StencilRefLessBackAMD or StencilRefGreaterBackAMD execution modes."
                  ;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar30 = 
                  "Fragment execution model entry points can specify at most one of StencilRefUnchangedFrontAMD, StencilRefLessFrontAMD or StencilRefGreaterFrontAMD execution modes."
                  ;
                }
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar30 = 
                "Fragment execution model entry points can specify at most one fragment shader interlock execution mode."
                ;
              }
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar30 = 
              "Fragment execution model entry points can specify at most one of DepthGreater, DepthLess or DepthUnchanged execution modes."
              ;
            }
          }
        }
        goto LAB_00595fcd;
      }
LAB_005961d6:
      bVar6 = spvIsVulkanEnv(_->context_->target_env);
      if ((EVar11 == ExecutionModelGLCompute) && (bVar6)) {
        if (psVar21 !=
            (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
             *)0x0) {
          local_208._0_4_ = 0x11;
          sVar22 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(psVar21,(key_type *)local_208);
          if (sVar22 != 0) goto LAB_00596215;
        }
        pIVar5 = (_->ordered_instructions_).
                 super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this = (_->ordered_instructions_).
                    super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start; this != pIVar5; this = this + 1) {
          uVar9 = (this->inst_).opcode;
          if (uVar9 == 0x47) {
            if (((0x20 < (ulong)((long)(this->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start)) &&
                (DVar17 = Instruction::GetOperandAs<spv::Decoration>(this,1), DVar17 == BuiltIn)) &&
               (BVar18 = Instruction::GetOperandAs<spv::BuiltIn>(this,2),
               BVar18 == BuiltInWorkgroupSize)) goto LAB_00596215;
            uVar9 = (this->inst_).opcode;
          }
          if ((uVar9 == 0x14b) &&
             (EVar16 = Instruction::GetOperandAs<spv::ExecutionMode>(this,1),
             EVar16 == ExecutionModeLocalSizeId)) goto LAB_00596215;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&x_size,_,0x191a,(char *)0x0);
        std::operator<<((ostream *)local_208,(string *)&x_size);
        pcVar30 = 
        "In the Vulkan environment, GLCompute execution model entry points require either the LocalSize or LocalSizeId execution mode or an object decorated with WorkgroupSize must be specified."
        ;
        goto LAB_005954f0;
      }
LAB_00596215:
      bVar6 = ValidationState_t::EntryPointHasLocalSizeOrId(_,uVar10);
      if ((bVar6) &&
         (pIVar19 = ValidationState_t::EntryPointLocalSizeOrId(_,uVar10),
         pIVar19 != (Instruction *)0x0)) {
        EVar16 = Instruction::GetOperandAs<spv::ExecutionMode>(pIVar19,1);
        uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar19,2);
        uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar19,3);
        id = Instruction::GetOperandAs<unsigned_int>(pIVar19,4);
        if (EVar16 == ExecutionModeLocalSizeId) {
          bVar6 = ValidationState_t::EvalConstantValUint64(_,uVar10,&x_size);
          bVar7 = ValidationState_t::EvalConstantValUint64(_,uVar12,&y_size);
          bVar8 = ValidationState_t::EvalConstantValUint64(_,id,&z_size);
          if ((((bVar6) && (bVar7)) && (bVar8)) &&
             (CONCAT44(y_size._4_4_,(uint)y_size) * CONCAT44(x_size._4_4_,(undefined4)x_size) *
              z_size == 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,pIVar19);
            std::operator<<((ostream *)local_208,
                            "Local Size Id execution mode must not have a product of zero (X = ");
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::operator<<((ostream *)local_208,", Y = ");
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::operator<<((ostream *)local_208,", Z = ");
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            pcVar30 = ").";
            goto LAB_00595fcd;
          }
          goto LAB_00595fe8;
        }
        if ((EVar16 != ExecutionModeLocalSize) || (uVar12 * uVar10 * id != 0)) goto LAB_00595fe8;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,pIVar19);
        std::operator<<((ostream *)local_208,
                        "Local Size execution mode must not have a product of zero (X = ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::operator<<((ostream *)local_208,", Y = ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::operator<<((ostream *)local_208,", Z = ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::operator<<((ostream *)local_208,").");
        sVar27 = local_38;
        goto LAB_00595fdf;
      }
      goto LAB_00595fe8;
    }
    uVar12 = Instruction::GetOperandAs<unsigned_int>(pIVar19,3);
    pIVar20 = ValidationState_t::FindDef(_,uVar12);
    if ((pIVar20 != (Instruction *)0x0) &&
       ((long)(pIVar20->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(pIVar20->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start == 0xc)) goto LAB_005950e1;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)&x_size,_,0x1219,(char *)0x0);
    std::operator<<((ostream *)local_208,(string *)&x_size);
    std::operator<<((ostream *)local_208,"OpEntryPoint Entry Point <id> ");
    ValidationState_t::getIdName_abi_cxx11_((string *)&y_size,_,uVar10);
    std::operator<<((ostream *)local_208,(string *)&y_size);
    pcVar30 = "s function parameter count is not zero.";
LAB_00595764:
    std::operator<<((ostream *)local_208,pcVar30);
    std::__cxx11::string::_M_dispose();
    sVar27 = local_38;
LAB_005954ff:
    std::__cxx11::string::_M_dispose();
    goto LAB_00595fdf;
  }
  y_size._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  _Var23 = std::
           __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                     ((_->entry_points_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (_->entry_points_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (_Var23._M_current ==
      (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"OpExecutionMode Entry Point <id> ");
    ValidationState_t::getIdName_abi_cxx11_((string *)&x_size,_,(uint)y_size);
    std::operator<<((ostream *)local_208,(string *)&x_size);
    pcVar30 = " is not the Entry Point operand of an OpEntryPoint.";
    goto LAB_005954f0;
  }
  EVar16 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
  if ((inst->inst_).opcode != 0x14b) {
    if (((0x20 < EVar16 - ExecutionModeIsApiEntryAMDX) ||
        ((0x10000008fU >> ((ulong)(EVar16 - ExecutionModeIsApiEntryAMDX) & 0x3f) & 1) == 0)) &&
       ((2 < EVar16 - ExecutionModeSubgroupsPerWorkgroupId &&
        (EVar16 != ExecutionModeFPFastMathDefault)))) goto LAB_00595560;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar30 = 
    "OpExecutionMode is only valid when the Mode operand is an execution mode that takes no Extra Operands, or takes Extra Operands that are not id operands."
    ;
    goto LAB_00595fcd;
  }
  uVar10 = EVar16 - ExecutionModeIsApiEntryAMDX;
  if ((((0x20 < uVar10) || ((0x10000008fU >> ((ulong)uVar10 & 0x3f) & 1) == 0)) &&
      (2 < EVar16 - ExecutionModeSubgroupsPerWorkgroupId)) &&
     ((EVar16 != ExecutionModeFPFastMathDefault && (EVar16 != ExecutionModeMaximumRegistersIdINTEL))
     )) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar30 = 
    "OpExecutionModeId is only valid when the Mode operand is an execution mode that takes Extra Operands that are id operands."
    ;
    goto LAB_00595fcd;
  }
  psVar3 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar4 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar28 = 2; uVar28 < (ulong)((long)psVar3 - (long)psVar4 >> 4); uVar28 = uVar28 + 1) {
    uVar12 = Instruction::GetOperandAs<unsigned_int>(inst,uVar28);
    pIVar19 = ValidationState_t::FindDef(_,uVar12);
    if (((uVar10 < 0x21) && ((0x10000008fU >> ((ulong)uVar10 & 0x3f) & 1) != 0)) ||
       (EVar16 - ExecutionModeSubgroupsPerWorkgroupId < 3)) {
      iVar13 = spvOpcodeIsConstant((uint)(pIVar19->inst_).opcode);
      if (iVar13 == 0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar30 = "For OpExecutionModeId all Extra Operand ids must be constant instructions.";
        goto LAB_00595fcd;
      }
    }
    else if (EVar16 == ExecutionModeFPFastMathDefault) {
      if (uVar28 == 2) {
        bVar6 = ValidationState_t::IsFloatScalarType(_,uVar12);
        if (!bVar6) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar30 = "The Target Type operand must be a floating-point scalar type";
          goto LAB_00595fcd;
        }
      }
      else {
        ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar12);
        if ((local_203 != '\x01') || (local_208[4] == false)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar30 = "The Fast Math Default operand must be a non-specialization constant";
          goto LAB_00595fcd;
        }
        if (0x7ffff < (uint)local_208._0_4_) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar30 = "The Fast Math Default operand is an invalid bitmask value";
          goto LAB_00595fcd;
        }
        if ((local_208._0_4_ & DepthUnchanged) != ExecutionModeInvocations) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar30 = "The Fast Math Default operand must not include Fast";
          goto LAB_00595fcd;
        }
        if ((~local_208._0_4_ & 0x30000) != 0 && 0x3ffff < (uint)local_208._0_4_) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar30 = 
          "The Fast Math Default operand must include AllowContract and AllowReassoc when AllowTransform is specified"
          ;
          goto LAB_00595fcd;
        }
      }
    }
  }
LAB_00595560:
  psVar24 = ValidationState_t::GetExecutionModels(_,(uint)y_size);
  switch(EVar16) {
  case ExecutionModeInvocations:
  case ExecutionModeInputPoints:
  case ExecutionModeInputLines:
  case ExecutionModeInputLinesAdjacency:
  case ExecutionModeInputTrianglesAdjacency:
  case ExecutionModeOutputLineStrip:
  case ExecutionModeOutputTriangleStrip:
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      if (p_Var26[1]._M_color != 3) goto LAB_00595faf;
    }
    break;
  case ExecutionModeSpacingEqual:
  case ExecutionModeSpacingFractionalEven:
  case ExecutionModeSpacingFractionalOdd:
  case ExecutionModeVertexOrderCw:
  case ExecutionModeVertexOrderCcw:
  case ExecutionModePointMode:
  case ExecutionModeQuads:
  case ExecutionModeIsolines:
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      if (p_Var26[1]._M_color - 3 < 0xfffffffe) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = "Execution mode can only be used with a tessellation execution model.";
        goto LAB_00595fcd;
      }
    }
    break;
  case ExecutionModePixelCenterInteger:
  case ExecutionModeOriginUpperLeft:
  case ExecutionModeOriginLowerLeft:
  case EarlyFragmentTests:
  case DepthReplacing:
  case DepthGreater:
  case DepthLess:
  case DepthUnchanged:
switchD_0059558f_caseD_6:
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      if (p_Var26[1]._M_color != 4) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = "Execution mode can only be used with the Fragment execution model.";
        goto LAB_00595fcd;
      }
    }
    break;
  case ExecutionModeXfb:
  case DepthReplacing|ExecutionModeSpacingEqual:
  case 0x20:
  case ExecutionModeInitializer:
  case ExecutionModeFinalizer:
  case ExecutionModeSubgroupSize:
  case ExecutionModeSubgroupsPerWorkgroup:
  case ExecutionModeSubgroupsPerWorkgroupId:
    break;
  case ExecutionModeLocalSize:
  case ExecutionModeLocalSizeId:
    if (((EVar16 == ExecutionModeLocalSizeId) && ((_->features_).env_allow_localsizeid == false)) &&
       (_->options_->allow_localsizeid == false)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar30 = "LocalSizeId mode is not allowed by the current environment.";
      goto LAB_00595fcd;
    }
    pCVar1 = &_->module_capabilities_;
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      _Var2 = p_Var26[1]._M_color;
      if (1 < _Var2 - 5) {
        if (_Var2 - 0x1493 < 2) {
          CVar29 = CapabilityMeshShadingNV;
LAB_00595939:
          bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CVar29);
          if (bVar6) goto LAB_00595946;
        }
        else if (_Var2 - 0x14f4 < 2) {
          CVar29 = CapabilityMeshShadingEXT;
          goto LAB_00595939;
        }
        bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingNV);
        if ((bVar6) ||
           (bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingEXT), bVar6)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar30 = 
          "Execution mode can only be used with a Kernel, GLCompute, MeshNV, MeshEXT, TaskNV or TaskEXT execution model."
          ;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar30 = "Execution mode can only be used with a Kernel or GLCompute execution model.";
        }
        goto LAB_00595fcd;
      }
LAB_00595946:
    }
    break;
  case ExecutionModeLocalSizeHint:
  case ExecutionModeVecTypeHint:
  case ContractionOff:
  case ExecutionModeLocalSizeHintId:
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      if (p_Var26[1]._M_color != 6) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = "Execution mode can only be used with the Kernel execution model.";
        goto LAB_00595fcd;
      }
    }
    break;
  case ExecutionModeTriangles:
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      if (p_Var26[1]._M_color - 4 < 0xfffffffd) goto LAB_00596063;
    }
    break;
  case ExecutionModeOutputVertices:
    pCVar1 = &_->module_capabilities_;
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      _Var2 = p_Var26[1]._M_color;
      if (2 < _Var2 - _S_black) {
        if (_Var2 == 0x1494) {
          CVar29 = CapabilityMeshShadingNV;
LAB_00595bbb:
          bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CVar29);
          if (bVar6) goto LAB_00595bc8;
        }
        else if (_Var2 == 0x14f5) {
          CVar29 = CapabilityMeshShadingEXT;
          goto LAB_00595bbb;
        }
        bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingNV);
        if ((!bVar6) &&
           (bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingEXT), !bVar6))
        goto LAB_00596063;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = 
        "Execution mode can only be used with a Geometry, tessellation, MeshNV or MeshEXT execution model."
        ;
        goto LAB_00595fcd;
      }
LAB_00595bc8:
    }
    bVar6 = spvIsVulkanEnv(_->context_->target_env);
    if (((bVar6) &&
        (bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingEXT), bVar6)) &&
       (uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,2), uVar10 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&x_size,_,0x1ca2,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&x_size);
      pcVar30 = 
      "In mesh shaders using the MeshEXT Execution Model the OutputVertices Execution Mode must be greater than 0"
      ;
      goto LAB_005954f0;
    }
    break;
  case ExecutionModeOutputPoints:
    pCVar1 = &_->module_capabilities_;
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      _Var2 = p_Var26[1]._M_color;
      if (_Var2 != 3) {
        if (_Var2 == 0x1494) {
          CVar29 = CapabilityMeshShadingNV;
LAB_00595b59:
          bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CVar29);
          if (bVar6) goto LAB_00595b66;
        }
        else if (_Var2 == 0x14f5) {
          CVar29 = CapabilityMeshShadingEXT;
          goto LAB_00595b59;
        }
        bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingNV);
        if ((!bVar6) &&
           (bVar6 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityMeshShadingEXT), !bVar6))
        goto LAB_00595faf;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = 
        "Execution mode can only be used with the Geometry MeshNV or MeshEXT execution model.";
        goto LAB_00595fcd;
      }
LAB_00595b66:
    }
    break;
  default:
    if (((EVar16 - ExecutionModeStencilRefUnchangedFrontAMD < 6) ||
        (EVar16 - ExecutionModePixelInterlockOrderedEXT < 6)) ||
       (EVar16 - ExecutionModeNonCoherentColorAttachmentReadEXT < 3)) goto switchD_0059558f_caseD_6;
    if ((0x1d < EVar16 - ExecutionModeOutputLinesEXT) ||
       ((0x20000003U >> (EVar16 - ExecutionModeOutputLinesEXT & 0x1f) & 1) == 0)) {
      if (EVar16 != EarlyAndLateFragmentTestsAMD) {
        if (EVar16 == ExecutionModeQuadDerivativesKHR) {
          for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
              p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
            if ((p_Var26[1]._M_color & ~_S_black) != 4) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar30 = 
              "Execution mode can only be used with the Fragment or GLCompute execution model.";
              goto LAB_00595fcd;
            }
          }
        }
        else if (EVar16 == ExecutionModeRequireFullQuadsKHR) goto switchD_0059558f_caseD_6;
        break;
      }
      goto switchD_0059558f_caseD_6;
    }
    for (p_Var26 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var26 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26)) {
      if ((p_Var26[1]._M_color != 0x14f5) && (p_Var26[1]._M_color != 0x1494)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = "Execution mode can only be used with the MeshEXT or MeshNV execution model.";
        goto LAB_00595fcd;
      }
    }
    if (EVar16 == ExecutionModeFPFastMathDefault) goto LAB_00595d38;
    if ((((EVar16 == ExecutionModeOutputPrimitivesEXT) &&
         (bVar6 = spvIsVulkanEnv(_->context_->target_env), bVar6)) &&
        (bVar6 = EnumSet<spv::Capability>::contains
                           (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar6)) &&
       (uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,2), uVar10 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&x_size,_,0x1ca3,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&x_size);
      pcVar30 = 
      "In mesh shaders using the MeshEXT Execution Model the OutputPrimitivesEXT Execution Mode must be greater than 0"
      ;
      goto LAB_005954f0;
    }
    goto LAB_00595dc0;
  }
  if (EVar16 == ExecutionModeFPFastMathDefault) {
LAB_00595d38:
    psVar21 = ValidationState_t::GetExecutionModes(_,(uint)y_size);
    if (psVar21 !=
        (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
         *)0x0) {
      local_208._0_4_ = 0x1f;
      sVar22 = std::
               set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               ::count(psVar21,(key_type *)local_208);
      if (sVar22 == 0) {
        local_208._0_4_ = 0x116d;
        sVar22 = std::
                 set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 ::count(psVar21,(key_type *)local_208);
        if (sVar22 == 0) goto LAB_00595dc0;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = 
        "FPFastMathDefault and SignedZeroInfNanPreserve execution modes cannot be applied to the same entry point"
        ;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar30 = 
        "FPFastMathDefault and ContractionOff execution modes cannot be applied to the same entry point"
        ;
      }
      goto LAB_00595fcd;
    }
  }
LAB_00595dc0:
  bVar6 = spvIsVulkanEnv(_->context_->target_env);
  if (bVar6) {
    if (EVar16 == ExecutionModePixelCenterInteger) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&x_size,_,0x122e,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&x_size);
      pcVar30 = "In the Vulkan environment, the PixelCenterInteger execution mode must not be used."
      ;
    }
    else {
      if (EVar16 != ExecutionModeOriginLowerLeft) goto LAB_00595fe8;
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&x_size,_,0x122d,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&x_size);
      pcVar30 = "In the Vulkan environment, the OriginLowerLeft execution mode must not be used.";
    }
LAB_005954f0:
    std::operator<<((ostream *)local_208,pcVar30);
    sVar27 = local_38;
    goto LAB_005954ff;
  }
  goto LAB_00595fe8;
LAB_00596063:
  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
  pcVar30 = "Execution mode can only be used with a Geometry or tessellation execution model.";
  goto LAB_00595fcd;
LAB_00595faf:
  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
  pcVar30 = "Execution mode can only be used with the Geometry execution model.";
LAB_00595fcd:
  std::operator<<((ostream *)local_208,pcVar30);
  sVar27 = local_38;
LAB_00595fdf:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  if (sVar27 == SPV_SUCCESS) {
LAB_00595fe8:
    sVar27 = SPV_SUCCESS;
  }
  return sVar27;
}

Assistant:

spv_result_t ModeSettingPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpEntryPoint:
      if (auto error = ValidateEntryPoint(_, inst)) return error;
      break;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      if (auto error = ValidateExecutionMode(_, inst)) return error;
      break;
    case spv::Op::OpMemoryModel:
      if (auto error = ValidateMemoryModel(_, inst)) return error;
      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}